

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_socket.hpp
# Opt level: O3

bool __thiscall
iutest::detail::SocketWriter::Write(SocketWriter *this,void *buf,size_t size,size_t cnt)

{
  bool bVar1;
  ssize_t sVar2;
  long lVar3;
  bool bVar4;
  
  if (*(int *)((this->super_IOutStream)._vptr_IOutStream[-3] +
              (long)&(this->super_IOutStream)._vptr_IOutStream) == -1) {
    bVar1 = false;
  }
  else if (cnt == 0) {
    bVar1 = true;
  }
  else {
    lVar3 = cnt - 1;
    do {
      sVar2 = write(*(int *)((this->super_IOutStream)._vptr_IOutStream[-3] +
                            (long)&(this->super_IOutStream)._vptr_IOutStream),buf,(long)(int)size);
      bVar4 = lVar3 != 0;
      lVar3 = lVar3 + -1;
      bVar1 = sVar2 != -1;
      if (sVar2 == -1) {
        return bVar1;
      }
    } while (bVar4);
  }
  return bVar1;
}

Assistant:

virtual bool Write(const void* buf, size_t size, size_t cnt) IUTEST_CXX_OVERRIDE
    {
        if( !IsValid() )
        {
            return false;
        }
        const int size_ = static_cast<int>(size);
        for( size_t i=0; i < cnt; ++i )
        {
#ifdef IUTEST_OS_WINDOWS
            if( send(m_socket, static_cast<const char*>(buf), size_, 0) == SOCKET_ERROR )
            {
                CheckLastError();
                return false;
            }
#else
            if( write(m_socket, buf, size_) == -1 )
            {
                return false;
            }
#endif
        }
        return true;
    }